

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_load.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalLoad::GetData
          (PhysicalLoad *this,ExecutionContext *context,DataChunk *chunk,OperatorSourceInput *input)

{
  string *url;
  size_type *this_00;
  ClientContext *pCVar1;
  pointer pLVar2;
  type pLVar3;
  InternalException *this_01;
  unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *this_02;
  allocator local_d1;
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  local_d0;
  string repository_url;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  undefined1 local_98 [24];
  bool local_80;
  bool local_7f;
  bool local_7e;
  ExtensionRepository repository;
  
  this_02 = &this->info;
  pLVar2 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     (this_02);
  if ((pLVar2->load_type != INSTALL) &&
     (pLVar2 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                         (this_02), pLVar2->load_type != FORCE_INSTALL)) {
    pCVar1 = context->client;
    pLVar2 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                       (this_02);
    ExtensionHelper::LoadExternalExtension(pCVar1,&pLVar2->filename);
    return FINISHED;
  }
  pLVar2 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     (this_02);
  if ((pLVar2->repository)._M_string_length == 0) {
    this_00 = &repository.name._M_string_length;
    repository.name._M_dataplus._M_p = (pointer)0x0;
    repository.name._M_string_length = (long)&repository.name.field_2 + 8;
    repository.name.field_2._M_allocated_capacity = 0;
    repository.name.field_2._M_local_buf[8] = '\0';
    repository.path._M_string_length._0_2_ = 0;
    repository.path._M_string_length._2_1_ = 0;
    pLVar2 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                       (this_02);
    repository.path._M_string_length._0_1_ = pLVar2->load_type == FORCE_INSTALL;
    repository.path._M_string_length._2_1_ = 1;
    unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->(this_02);
    ::std::__cxx11::string::_M_assign((string *)this_00);
    pCVar1 = context->client;
    pLVar2 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                       (this_02);
    ExtensionHelper::InstallExtension
              ((ExtensionHelper *)&local_d0,pCVar1,&pLVar2->filename,
               (ExtensionInstallOptions *)&repository);
    ::std::
    unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>::
    ~unique_ptr(&local_d0);
    ::std::__cxx11::string::~string((string *)this_00);
  }
  else {
    pCVar1 = context->client;
    pLVar3 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator*
                       (this_02);
    ExtensionRepository::ExtensionRepository(&repository);
    if ((pLVar3->repository)._M_string_length != 0) {
      url = &pLVar3->repository;
      if (pLVar3->repo_is_alias == true) {
        ExtensionRepository::TryGetRepositoryUrl(&repository_url,url);
        if (repository_url._M_string_length == 0) {
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_a8,"The repository alias failed to resolve",&local_d1);
          InternalException::InternalException(this_01,(string *)local_a8);
          __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ExtensionRepository::ExtensionRepository
                  ((ExtensionRepository *)local_a8,url,&repository_url);
        ExtensionRepository::operator=(&repository,(ExtensionRepository *)local_a8);
        ExtensionRepository::~ExtensionRepository((ExtensionRepository *)local_a8);
        ::std::__cxx11::string::~string((string *)&repository_url);
      }
      else {
        ExtensionRepository::GetRepositoryByUrl((ExtensionRepository *)local_a8,url);
        ExtensionRepository::operator=(&repository,(ExtensionRepository *)local_a8);
        ExtensionRepository::~ExtensionRepository((ExtensionRepository *)local_a8);
      }
    }
    local_a8 = (undefined1  [8])0x0;
    local_a0._M_p = local_98 + 8;
    local_98._0_8_ = 0;
    local_98[8] = '\0';
    local_7f = false;
    local_80 = pLVar3->load_type == FORCE_INSTALL;
    local_7e = true;
    ::std::__cxx11::string::_M_assign((string *)&local_a0);
    local_a8 = (undefined1  [8])&repository;
    ExtensionHelper::InstallExtension
              ((ExtensionHelper *)&repository_url,pCVar1,&pLVar3->filename,
               (ExtensionInstallOptions *)local_a8);
    ::std::
    unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>::
    ~unique_ptr((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 *)&repository_url);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ExtensionRepository::~ExtensionRepository(&repository);
  }
  return FINISHED;
}

Assistant:

SourceResultType PhysicalLoad::GetData(ExecutionContext &context, DataChunk &chunk, OperatorSourceInput &input) const {
	if (info->load_type == LoadType::INSTALL || info->load_type == LoadType::FORCE_INSTALL) {
		if (info->repository.empty()) {
			ExtensionInstallOptions options;
			options.force_install = info->load_type == LoadType::FORCE_INSTALL;
			options.throw_on_origin_mismatch = true;
			options.version = info->version;
			ExtensionHelper::InstallExtension(context.client, info->filename, options);
		} else {
			InstallFromRepository(context.client, *info);
		}

	} else {
		ExtensionHelper::LoadExternalExtension(context.client, info->filename);
	}

	return SourceResultType::FINISHED;
}